

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,int>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  Vector *pVVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  idx_t iVar8;
  char *pcVar9;
  idx_t iVar10;
  idx_t iVar11;
  undefined8 *puVar12;
  ulong uVar13;
  bool bVar14;
  string_t new_value;
  SelectionVector sel;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  Vector sort_key;
  Vector sliced_input;
  sel_t assign_sel [2048];
  SelectionVector local_2218;
  Vector *local_2200;
  LogicalType local_21f8 [24];
  long *local_21e0;
  long local_21d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_21c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_21a0;
  long *local_2198;
  long local_2190;
  long local_2188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2158;
  long *local_2150 [2];
  long local_2140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2110;
  Vector local_2108 [8];
  LogicalType local_2100 [24];
  long local_20e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20a8;
  Vector local_20a0 [8];
  LogicalType local_2098 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2068;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2050;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2040;
  sel_t local_2038 [2050];
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_2150);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_2198);
  local_2200 = inputs;
  duckdb::Vector::ToUnifiedFormat((ulong)(inputs + 0x68),(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_21e0);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  if (count == 0) {
    uVar7 = 0;
  }
  else {
    lVar2 = *local_2198;
    pcVar9 = (char *)0x0;
    uVar7 = 0;
    iVar8 = 0;
    do {
      iVar10 = iVar8;
      if (lVar2 != 0) {
        iVar10 = (idx_t)*(uint *)(lVar2 + iVar8 * 4);
      }
      if ((local_2188 == 0) ||
         ((*(ulong *)(local_2188 + (iVar10 >> 6) * 8) >> (iVar10 & 0x3f) & 1) != 0)) {
        iVar11 = iVar8;
        if (*local_2150[0] != 0) {
          iVar11 = (idx_t)*(uint *)(*local_2150[0] + iVar8 * 4);
        }
        if (local_2140 == 0) {
          bVar14 = true;
        }
        else {
          bVar14 = (*(ulong *)(local_2140 + (iVar11 >> 6) * 8) >> (iVar11 & 0x3f) & 1) != 0;
        }
        iVar11 = iVar8;
        if (*local_21e0 != 0) {
          iVar11 = (idx_t)*(uint *)(*local_21e0 + iVar8 * 4);
        }
        iVar1 = *(int *)(local_2190 + iVar10 * 4);
        pcVar3 = *(char **)(local_21d8 + iVar11 * 8);
        if ((*pcVar3 != '\x01') || (iVar1 < *(int *)(pcVar3 + 0x18))) {
          *(int *)(pcVar3 + 0x18) = iVar1;
          pcVar3[1] = bVar14 ^ 1;
          if (bVar14) {
            lVar6 = uVar7 - (pcVar3 == pcVar9);
            local_2038[lVar6] = (sel_t)iVar8;
            uVar7 = lVar6 + 1;
            pcVar9 = pcVar3;
          }
          *pcVar3 = '\x01';
        }
      }
      iVar8 = iVar8 + 1;
    } while (count != iVar8);
  }
  if (uVar7 != 0) {
    duckdb::LogicalType::LogicalType(local_21f8,BLOB);
    duckdb::Vector::Vector(local_2108,local_21f8,0x800);
    pVVar4 = local_2200;
    duckdb::LogicalType::~LogicalType(local_21f8);
    local_2218.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2218.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_2218.sel_vector = local_2038;
    duckdb::Vector::Vector(local_20a0,pVVar4,&local_2218,uVar7);
    duckdb::CreateSortKeyHelpers::CreateSortKey(local_20a0,uVar7,(OrderModifiers)0x302,local_2108);
    puVar12 = (undefined8 *)(local_20e8 + 8);
    uVar13 = 0;
    do {
      uVar5 = uVar13;
      if (local_2218.sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)local_2218.sel_vector[uVar13];
      }
      lVar2 = *local_21e0;
      if (lVar2 != 0) {
        uVar5 = (ulong)*(uint *)(lVar2 + uVar5 * 4);
      }
      new_value.value.pointer.ptr = (char *)lVar2;
      new_value.value._0_8_ = *puVar12;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)(*(long *)(local_21d8 + uVar5 * 8) + 8),
                 (string_t *)puVar12[-1],new_value);
      uVar13 = uVar13 + 1;
      puVar12 = puVar12 + 2;
    } while (uVar7 + (uVar7 == 0) != uVar13);
    if (local_2040 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2040);
    }
    if (local_2050 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2050);
    }
    if (local_2068 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2068);
    }
    duckdb::LogicalType::~LogicalType(local_2098);
    if (local_2218.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2218.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_20a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20a8);
    }
    if (local_20b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20b8);
    }
    if (local_20d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20d0);
    }
    duckdb::LogicalType::~LogicalType(local_2100);
  }
  if (local_21a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_21a0);
  }
  if (local_21c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_21c0);
  }
  if (local_2158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2158);
  }
  if (local_2178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2178);
  }
  if (local_2110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2110);
  }
  if (local_2130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2130);
  }
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}